

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O0

Parse * __thiscall
trieste::Parse::gen(Parse *this,
                   initializer_list<std::pair<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>_>
                   g)

{
  const_iterator ppVar1;
  type *__k;
  type *__x;
  mapped_type *this_00;
  type *f;
  type *type;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<std::pair<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>_>
  *__range2;
  Parse *this_local;
  initializer_list<std::pair<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>_>
  g_local;
  
  g_local._M_array = (iterator)g._M_len;
  this_local = (Parse *)g._M_array;
  __end2 = std::
           initializer_list<std::pair<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>_>
           ::begin((initializer_list<std::pair<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>_>
                    *)&this_local);
  ppVar1 = std::
           initializer_list<std::pair<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>_>
           ::end((initializer_list<std::pair<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>_>
                  *)&this_local);
  for (; __end2 != ppVar1; __end2 = __end2 + 1) {
    __k = std::
          get<0ul,trieste::Token,std::function<std::__cxx11::string(xoroshiro::detail::XorOshiro<unsigned_long,unsigned_int,55ul,14ul,36ul>&)>>
                    (__end2);
    __x = std::
          get<1ul,trieste::Token,std::function<std::__cxx11::string(xoroshiro::detail::XorOshiro<unsigned_long,unsigned_int,55ul,14ul,36ul>&)>>
                    (__end2);
    this_00 = std::
              map<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>_>_>
              ::operator[](&this->gens,__k);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
    ::operator=(this_00,__x);
  }
  return this;
}

Assistant:

Parse& gen(std::initializer_list<std::pair<Token, GenLocationF>> g)
    {
      for (auto& [type, f] : g)
        gens[type] = f;

      return *this;
    }